

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_loadstring(lua_State *L)

{
  StkId pTVar1;
  int iVar2;
  char *def;
  char *chunkname;
  int iVar3;
  size_t l;
  size_t local_38;
  char *local_30;
  size_t local_28;
  
  iVar3 = 1;
  def = luaL_checklstring(L,1,&local_38);
  chunkname = luaL_optlstring(L,2,def,(size_t *)0x0);
  local_28 = local_38;
  local_30 = def;
  iVar2 = lua_load(L,getS,&local_30,chunkname);
  if (iVar2 != 0) {
    pTVar1 = L->top;
    pTVar1->tt = 0;
    L->top = pTVar1 + 1;
    lua_insert(L,-2);
    iVar3 = 2;
  }
  return iVar3;
}

Assistant:

static int luaB_loadstring(lua_State*L){
size_t l;
const char*s=luaL_checklstring(L,1,&l);
const char*chunkname=luaL_optstring(L,2,s);
return load_aux(L,luaL_loadbuffer(L,s,l,chunkname));
}